

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O2

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextResonanceWaveLogSample(LA32WaveGenerator *this)

{
  sbyte sVar1;
  Tables *pTVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if ((this->resonancePhase | NEGATIVE_FALLING_RESONANCE_SINE_SEGMENT) ==
      NEGATIVE_RISING_RESONANCE_SINE_SEGMENT) {
    pTVar2 = Tables::getInstance();
    uVar4 = this->resonanceSinePosition;
    uVar3 = ~uVar4;
  }
  else {
    pTVar2 = Tables::getInstance();
    uVar4 = this->resonanceSinePosition;
    uVar3 = uVar4;
  }
  iVar5 = (this->amp >> 10) + (uint)pTVar2->logsin9[uVar3 >> 9 & 0x1ff] * 4 +
          this->resonanceAmpSubtraction +
          ((uVar4 >> 4) * ((uint)(2 < (int)this->phase) + this->resAmpDecayFactor) >> 8);
  switch(this->phase) {
  case POSITIVE_RISING_SINE_SEGMENT:
  case NEGATIVE_FALLING_SINE_SEGMENT:
    pTVar2 = Tables::getInstance();
    uVar4 = this->squareWavePosition;
    sVar1 = 2;
    break;
  default:
    goto switchD_0011d760_caseD_1;
  case POSITIVE_FALLING_SINE_SEGMENT:
  case NEGATIVE_RISING_SINE_SEGMENT:
    pTVar2 = Tables::getInstance();
    uVar4 = ~this->squareWavePosition;
    sVar1 = 3;
  }
  iVar5 = iVar5 + ((uint)pTVar2->logsin9[uVar4 >> 9 & 0x1ff] << sVar1);
switchD_0011d760_caseD_1:
  uVar4 = this->cutoffVal;
  if (uVar4 < 0x2000000) {
    iVar5 = iVar5 + (0x2000000 - uVar4 >> 9) + 0x7bff;
  }
  else if (uVar4 < 0x2400000) {
    pTVar2 = Tables::getInstance();
    iVar5 = iVar5 + (uint)pTVar2->logsin9[uVar4 + 0xfe000000 >> 0xd] * 4;
  }
  uVar4 = 0xffff;
  if (iVar5 - 0x1000U < 0x10000) {
    uVar4 = iVar5 - 0x1000U;
  }
  (this->resonanceLogSample).logValue = (Bit16u)uVar4;
  (this->resonanceLogSample).sign = (uint)(1 < (int)this->resonancePhase);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextResonanceWaveLogSample() {
	Bit32u logSampleValue;
	if (resonancePhase == POSITIVE_FALLING_RESONANCE_SINE_SEGMENT || resonancePhase == NEGATIVE_RISING_RESONANCE_SINE_SEGMENT) {
		logSampleValue = Tables::getInstance().logsin9[~(resonanceSinePosition >> 9) & 511];
	} else {
		logSampleValue = Tables::getInstance().logsin9[(resonanceSinePosition >> 9) & 511];
	}
	logSampleValue <<= 2;
	logSampleValue += amp >> 10;

	// From the digital captures, the decaying speed of the resonance sine is found a bit different for the positive and the negative segments
	Bit32u decayFactor = phase < NEGATIVE_FALLING_SINE_SEGMENT ? resAmpDecayFactor : resAmpDecayFactor + 1;
	// Unsure about resonanceSinePosition here. It's possible that dedicated counter & decrement are used. Although, cutoff is finely ramped, so maybe not.
	logSampleValue += resonanceAmpSubtraction + (((resonanceSinePosition >> 4) * decayFactor) >> 8);

	// To ensure the output wave has no breaks, two different windows are applied to the beginning and the ending of the resonance sine segment
	if (phase == POSITIVE_RISING_SINE_SEGMENT || phase == NEGATIVE_FALLING_SINE_SEGMENT) {
		// The window is synchronous sine here
		logSampleValue += Tables::getInstance().logsin9[(squareWavePosition >> 9) & 511] << 2;
	} else if (phase == POSITIVE_FALLING_SINE_SEGMENT || phase == NEGATIVE_RISING_SINE_SEGMENT) {
		// The window is synchronous square sine here
		logSampleValue += Tables::getInstance().logsin9[~(squareWavePosition >> 9) & 511] << 3;
	}

	if (cutoffVal < MIDDLE_CUTOFF_VALUE) {
		// For the cutoff values below the cutoff middle point, it seems the amp of the resonance wave is exponentially decayed
		logSampleValue += 31743 + ((MIDDLE_CUTOFF_VALUE - cutoffVal) >> 9);
	} else if (cutoffVal < RESONANCE_DECAY_THRESHOLD_CUTOFF_VALUE) {
		// For the cutoff values below this point, the amp of the resonance wave is sinusoidally decayed
		Bit32u sineIx = (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 13;
		logSampleValue += Tables::getInstance().logsin9[sineIx] << 2;
	}

	// After all the amp decrements are added, it should be safe now to adjust the amp of the resonance wave to what we see on captures
	logSampleValue -= 1 << 12;

	resonanceLogSample.logValue = logSampleValue < 65536 ? Bit16u(logSampleValue) : 65535;
	resonanceLogSample.sign = resonancePhase < NEGATIVE_FALLING_RESONANCE_SINE_SEGMENT ? LogSample::POSITIVE : LogSample::NEGATIVE;
}